

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode Curl_client_write(connectdata *conn,int type,char *ptr,size_t len)

{
  curl_off_t *pcVar1;
  Curl_easy *pCVar2;
  CURLcode CVar3;
  short *psVar4;
  curl_write_callback p_Var5;
  size_t sVar6;
  size_t sVar7;
  short *psVar8;
  curl_write_callback p_Var9;
  char *pcVar10;
  size_t sVar11;
  
  pCVar2 = conn->data;
  if (len == 0) {
    len = strlen(ptr);
  }
  if (((((type & 1U) != 0) && ((conn->handler->protocol & 0xc) != 0)) &&
      ((conn->proto).ftpc.transfertype == 'A')) && (len != 0 && ptr != (char *)0x0)) {
    if ((pCVar2->state).prev_block_had_trailing_cr == true) {
      if (*ptr == '\n') {
        len = len - 1;
        memmove(ptr,ptr + 1,len);
        pcVar1 = &(pCVar2->state).crlf_conversions;
        *pcVar1 = *pcVar1 + 1;
      }
      (pCVar2->state).prev_block_had_trailing_cr = false;
    }
    psVar4 = (short *)memchr(ptr,0xd,len);
    if (psVar4 != (short *)0x0) {
      psVar8 = psVar4;
      for (; psVar4 < ptr + (len - 1); psVar4 = (short *)((long)psVar4 + 1)) {
        if (*psVar4 == 0xa0d) {
          pcVar10 = (char *)((long)psVar4 + 1);
          psVar4 = (short *)((long)psVar4 + 1);
          *(char *)psVar8 = *pcVar10;
          pcVar1 = &(pCVar2->state).crlf_conversions;
          *pcVar1 = *pcVar1 + 1;
        }
        else if ((char)*psVar4 == '\r') {
          *(char *)psVar8 = '\n';
        }
        else {
          *(char *)psVar8 = (char)*psVar4;
        }
        psVar8 = (short *)((long)psVar8 + 1);
      }
      if (psVar4 < ptr + len) {
        if ((char)*psVar4 == '\r') {
          *(char *)psVar8 = '\n';
          (pCVar2->state).prev_block_had_trailing_cr = true;
        }
        else {
          *(char *)psVar8 = (char)*psVar4;
        }
        psVar8 = (short *)((long)psVar8 + 1);
      }
      if (psVar8 < ptr + len) {
        *(char *)psVar8 = '\0';
      }
      len = (long)psVar8 - (long)ptr;
    }
  }
  if (len == 0) {
    return CURLE_OK;
  }
  pCVar2 = conn->data;
  sVar7 = len;
  pcVar10 = ptr;
  if (((pCVar2->req).keepon & 0x10) != 0) goto LAB_00120352;
  if ((type & 1U) == 0) {
    p_Var9 = (curl_write_callback)0x0;
  }
  else {
    p_Var9 = (pCVar2->set).fwrite_func;
  }
  if ((type & 2U) == 0) {
LAB_00120378:
    p_Var5 = (curl_write_callback)0x0;
  }
  else {
    p_Var5 = (pCVar2->set).fwrite_header;
    if (p_Var5 == (curl_write_callback)0x0) {
      if ((pCVar2->set).writeheader == (void *)0x0) goto LAB_00120378;
      p_Var5 = (pCVar2->set).fwrite_func;
    }
  }
  for (; sVar7 != 0; sVar7 = sVar7 - sVar11) {
    sVar11 = 0x4000;
    if (sVar7 < 0x4000) {
      sVar11 = sVar7;
    }
    if (p_Var9 != (curl_write_callback)0x0) {
      sVar6 = (*p_Var9)(pcVar10,1,sVar11,(pCVar2->set).out);
      if (sVar6 == 0x10000001) {
        if ((conn->handler->flags & 0x10) == 0) goto LAB_00120352;
        pcVar10 = "Write callback asked for PAUSE when not supported!";
        goto LAB_001204b0;
      }
      if (sVar6 != sVar11) {
        Curl_failf(pCVar2,"Failed writing body (%zu != %zu)",sVar6,sVar11);
        return CURLE_WRITE_ERROR;
      }
    }
    pcVar10 = pcVar10 + sVar11;
  }
  if (p_Var5 == (curl_write_callback)0x0) {
    return CURLE_OK;
  }
  Curl_set_in_callback(pCVar2,true);
  sVar7 = (*p_Var5)(ptr,1,len,(pCVar2->set).writeheader);
  Curl_set_in_callback(pCVar2,false);
  if (sVar7 != 0x10000001) {
    if (sVar7 == len) {
      return CURLE_OK;
    }
    pcVar10 = "Failed writing header";
LAB_001204b0:
    Curl_failf(pCVar2,pcVar10);
    return CURLE_WRITE_ERROR;
  }
  type = 2;
  sVar7 = len;
  pcVar10 = ptr;
LAB_00120352:
  CVar3 = pausewrite(pCVar2,type,pcVar10,sVar7);
  return CVar3;
}

Assistant:

CURLcode Curl_client_write(struct connectdata *conn,
                           int type,
                           char *ptr,
                           size_t len)
{
  struct Curl_easy *data = conn->data;

  if(0 == len)
    len = strlen(ptr);

  DEBUGASSERT(type <= 3);

  /* FTP data may need conversion. */
  if((type & CLIENTWRITE_BODY) &&
    (conn->handler->protocol & PROTO_FAMILY_FTP) &&
    conn->proto.ftpc.transfertype == 'A') {
    /* convert from the network encoding */
    CURLcode result = Curl_convert_from_network(data, ptr, len);
    /* Curl_convert_from_network calls failf if unsuccessful */
    if(result)
      return result;

#ifdef CURL_DO_LINEEND_CONV
    /* convert end-of-line markers */
    len = convert_lineends(data, ptr, len);
#endif /* CURL_DO_LINEEND_CONV */
    }

  return chop_write(conn, type, ptr, len);
}